

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# converttif.c
# Opt level: O2

int imagetotif(opj_image_t *image,char *outfile)

{
  OPJ_UINT32 OVar1;
  opj_image_comp_t *poVar2;
  convert_32s_PXCX p_Var3;
  opj_image_comp_t *poVar4;
  long lVar5;
  size_t __size;
  OPJ_BYTE *pOVar6;
  OPJ_INT32 *__ptr;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  OPJ_INT32 OVar10;
  ulong uVar11;
  char *pcVar12;
  ulong uVar13;
  long lVar14;
  size_t sStack_90;
  convert_32sXXx_C1R local_88;
  OPJ_INT32 *planes [4];
  
  poVar2 = image->comps;
  uVar9 = poVar2->prec;
  planes[0] = poVar2->data;
  uVar8 = image->numcomps;
  uVar7 = 4;
  if (image->color_space == OPJ_CLRSPC_CMYK) {
    if (3 < uVar8) {
      sStack_90 = 5;
      goto LAB_0010e45d;
    }
    pcVar12 = "imagetotif: CMYK images shall be composed of at least 4 planes.\n";
    sStack_90 = 0x40;
  }
  else {
    if (uVar8 < 3) {
      sStack_90 = 1;
      uVar7 = uVar8;
    }
    else {
      if (uVar8 < 4) {
        uVar7 = uVar8;
      }
      sStack_90 = 2;
    }
LAB_0010e45d:
    uVar13 = (ulong)uVar7;
    uVar8 = uVar7 + (uVar7 == 0);
    poVar4 = poVar2;
    for (uVar11 = 1; uVar11 < uVar13; uVar11 = uVar11 + 1) {
      if ((((poVar2->dx != poVar4[1].dx) || (poVar2->dy != poVar4[1].dy)) ||
          (uVar9 != poVar4[1].prec)) || (poVar2->sgnd != poVar4[1].sgnd)) {
        uVar8 = (uint)uVar11;
        break;
      }
      planes[uVar11] = poVar4[1].data;
      poVar4 = poVar4 + 1;
    }
    if (uVar8 == uVar7) {
      uVar8 = 0;
      if ((uVar9 & 0xffff) < 0x11) {
        uVar8 = uVar9;
      }
      if ((short)uVar8 == 0) {
        fprintf(_stderr,"imagetotif: Bits=%d, Only 1 to 16 bits implemented\n",0);
        goto LAB_0010e8a1;
      }
      lVar5 = TIFFOpen(outfile,"wb");
      if (lVar5 == 0) {
        fprintf(_stderr,"imagetotif:failed to open %s for writing\n",outfile);
        return 1;
      }
      uVar8 = uVar8 & 0xffff;
      for (lVar14 = 0; uVar13 << 6 != lVar14; lVar14 = lVar14 + 0x40) {
        clip_component((opj_image_comp_t *)((long)&image->comps->dx + lVar14),image->comps->prec);
      }
      OVar10 = 0;
      switch(uVar8) {
      case 1:
      case 2:
      case 4:
      case 6:
      case 8:
        local_88 = convert_32sXXu_C1R_LUT[uVar8];
        break;
      case 3:
        local_88 = tif_32sto3u;
        break;
      case 5:
        local_88 = tif_32sto5u;
        break;
      case 7:
        local_88 = tif_32sto7u;
        break;
      case 9:
        local_88 = tif_32sto9u;
        break;
      case 10:
        local_88 = tif_32sto10u;
        break;
      case 0xb:
        local_88 = tif_32sto11u;
        break;
      case 0xc:
        local_88 = tif_32sto12u;
        break;
      case 0xd:
        local_88 = tif_32sto13u;
        break;
      case 0xe:
        local_88 = tif_32sto14u;
        break;
      case 0xf:
        local_88 = tif_32sto15u;
        break;
      case 0x10:
        local_88 = tif_32sto16u;
        break;
      default:
        local_88 = (convert_32sXXx_C1R)0x0;
      }
      poVar2 = image->comps;
      if (poVar2->sgnd != 0) {
        OVar10 = 1 << ((char)poVar2->prec - 1U & 0x1f);
      }
      p_Var3 = convert_32s_PXCX_LUT[uVar13];
      uVar9 = poVar2->w;
      uVar11 = (ulong)uVar9;
      OVar1 = poVar2->h;
      TIFFSetField(lVar5,0x100,uVar11);
      TIFFSetField(lVar5,0x101,OVar1);
      TIFFSetField(lVar5,0x115,uVar13);
      TIFFSetField(lVar5,0x102,uVar8);
      TIFFSetField(lVar5,0x112,1);
      TIFFSetField(lVar5,0x11c,1);
      TIFFSetField(lVar5,0x106,sStack_90);
      TIFFSetField(lVar5,0x116,1);
      __size = TIFFStripSize(lVar5);
      if ((int)(uVar13 * uVar11 >> 0x20) == 0) {
        uVar9 = uVar9 * uVar7;
        if ((0x3fffffff < uVar9) || ((int)((ulong)uVar8 * (ulong)uVar9 >> 0x20) != 0))
        goto LAB_0010e737;
        if (__size == uVar9 * uVar8 + 7 >> 3) {
          pOVar6 = (OPJ_BYTE *)malloc(__size);
          if (pOVar6 != (OPJ_BYTE *)0x0) {
            __ptr = (OPJ_INT32 *)malloc(uVar13 * uVar11 * 4);
            if (__ptr != (OPJ_INT32 *)0x0) {
              for (uVar9 = 0; uVar9 < image->comps->h; uVar9 = uVar9 + 1) {
                (*p_Var3)(planes,__ptr,uVar11,OVar10);
                (*local_88)(__ptr,pOVar6,uVar13 * uVar11);
                TIFFWriteEncodedStrip(lVar5,uVar9,pOVar6,__size);
                planes[0] = planes[0] + uVar11;
                planes[1] = planes[1] + uVar11;
                planes[2] = planes[2] + uVar11;
                planes[3] = planes[3] + uVar11;
              }
              _TIFFfree(pOVar6);
              TIFFClose(lVar5);
              free(__ptr);
              return 0;
            }
            _TIFFfree(pOVar6);
          }
          goto LAB_0010e866;
        }
        pcVar12 = "Invalid TIFF strip size\n";
        sStack_90 = 0x18;
      }
      else {
LAB_0010e737:
        pcVar12 = "Buffer overflow\n";
        sStack_90 = 0x10;
      }
      fwrite(pcVar12,sStack_90,1,_stderr);
LAB_0010e866:
      TIFFClose(lVar5);
      return 1;
    }
    pcVar12 = "imagetotif: All components shall have the same subsampling, same bit depth.\n";
    sStack_90 = 0x4c;
  }
  fwrite(pcVar12,sStack_90,1,_stderr);
LAB_0010e8a1:
  fwrite("\tAborting\n",10,1,_stderr);
  return 1;
}

Assistant:

int imagetotif(opj_image_t * image, const char *outfile)
{
    TIFF *tif;
    tdata_t buf;
    uint32 width, height;
    uint16 bps, tiPhoto;
    int adjust, sgnd;
    int64_t strip_size, rowStride, TIFF_MAX;
    OPJ_UINT32 i, numcomps;
    OPJ_INT32* buffer32s = NULL;
    OPJ_INT32 const* planes[4];
    convert_32s_PXCX cvtPxToCx = NULL;
    convert_32sXXx_C1R cvt32sToTif = NULL;

    bps = (uint16)image->comps[0].prec;
    planes[0] = image->comps[0].data;

    numcomps = image->numcomps;

    if (image->color_space == OPJ_CLRSPC_CMYK) {
        if (numcomps < 4U) {
            fprintf(stderr,
                    "imagetotif: CMYK images shall be composed of at least 4 planes.\n");
            fprintf(stderr, "\tAborting\n");
            return 1;
        }
        tiPhoto = PHOTOMETRIC_SEPARATED;
        if (numcomps > 4U) {
            numcomps = 4U; /* Alpha not supported */
        }
    } else if (numcomps > 2U) {
        tiPhoto = PHOTOMETRIC_RGB;
        if (numcomps > 4U) {
            numcomps = 4U;
        }
    } else {
        tiPhoto = PHOTOMETRIC_MINISBLACK;
    }
    for (i = 1U; i < numcomps; ++i) {
        if (image->comps[0].dx != image->comps[i].dx) {
            break;
        }
        if (image->comps[0].dy != image->comps[i].dy) {
            break;
        }
        if (image->comps[0].prec != image->comps[i].prec) {
            break;
        }
        if (image->comps[0].sgnd != image->comps[i].sgnd) {
            break;
        }
        planes[i] = image->comps[i].data;
    }
    if (i != numcomps) {
        fprintf(stderr,
                "imagetotif: All components shall have the same subsampling, same bit depth.\n");
        fprintf(stderr, "\tAborting\n");
        return 1;
    }

    if (bps > 16) {
        bps = 0;
    }
    if (bps == 0) {
        fprintf(stderr, "imagetotif: Bits=%d, Only 1 to 16 bits implemented\n", bps);
        fprintf(stderr, "\tAborting\n");
        return 1;
    }
    tif = TIFFOpen(outfile, "wb");
    if (!tif) {
        fprintf(stderr, "imagetotif:failed to open %s for writing\n", outfile);
        return 1;
    }
    for (i = 0U; i < numcomps; ++i) {
        clip_component(&(image->comps[i]), image->comps[0].prec);
    }
    cvtPxToCx = convert_32s_PXCX_LUT[numcomps];
    switch (bps) {
    case 1:
    case 2:
    case 4:
    case 6:
    case 8:
        cvt32sToTif = convert_32sXXu_C1R_LUT[bps];
        break;
    case 3:
        cvt32sToTif = tif_32sto3u;
        break;
    case 5:
        cvt32sToTif = tif_32sto5u;
        break;
    case 7:
        cvt32sToTif = tif_32sto7u;
        break;
    case 9:
        cvt32sToTif = tif_32sto9u;
        break;
    case 10:
        cvt32sToTif = tif_32sto10u;
        break;
    case 11:
        cvt32sToTif = tif_32sto11u;
        break;
    case 12:
        cvt32sToTif = tif_32sto12u;
        break;
    case 13:
        cvt32sToTif = tif_32sto13u;
        break;
    case 14:
        cvt32sToTif = tif_32sto14u;
        break;
    case 15:
        cvt32sToTif = tif_32sto15u;
        break;
    case 16:
        cvt32sToTif = (convert_32sXXx_C1R)tif_32sto16u;
        break;
    default:
        /* never here */
        break;
    }
    sgnd = (int)image->comps[0].sgnd;
    adjust = sgnd ? (int)(1 << (image->comps[0].prec - 1)) : 0;
    width   = (uint32)image->comps[0].w;
    height  = (uint32)image->comps[0].h;

    TIFFSetField(tif, TIFFTAG_IMAGEWIDTH, width);
    TIFFSetField(tif, TIFFTAG_IMAGELENGTH, height);
    TIFFSetField(tif, TIFFTAG_SAMPLESPERPIXEL, (uint16)numcomps);
    TIFFSetField(tif, TIFFTAG_BITSPERSAMPLE, bps);
    TIFFSetField(tif, TIFFTAG_ORIENTATION, ORIENTATION_TOPLEFT);
    TIFFSetField(tif, TIFFTAG_PLANARCONFIG, PLANARCONFIG_CONTIG);
    TIFFSetField(tif, TIFFTAG_PHOTOMETRIC, tiPhoto);
    TIFFSetField(tif, TIFFTAG_ROWSPERSTRIP, 1);
    if (sizeof(tsize_t) == 4) {
        TIFF_MAX = INT_MAX;
    } else {
        TIFF_MAX = UINT_MAX;
    }
    strip_size = (int64_t)TIFFStripSize(tif);

    if ((int64_t)width > (int64_t)(TIFF_MAX / numcomps) ||
            (int64_t)(width * numcomps) > (int64_t)(TIFF_MAX / bps) ||
            (int64_t)(width * numcomps) > (int64_t)(TIFF_MAX / (int64_t)sizeof(
                        OPJ_INT32))) {
        fprintf(stderr, "Buffer overflow\n");
        TIFFClose(tif);
        return 1;
    }
    rowStride = (int64_t)((width * numcomps * bps + 7U) / 8U);
    if (rowStride != strip_size) {
        fprintf(stderr, "Invalid TIFF strip size\n");
        TIFFClose(tif);
        return 1;
    }
    buf = malloc((OPJ_SIZE_T)strip_size);
    if (buf == NULL) {
        TIFFClose(tif);
        return 1;
    }
    buffer32s = (OPJ_INT32 *)malloc(sizeof(OPJ_INT32) * width * numcomps);
    if (buffer32s == NULL) {
        _TIFFfree(buf);
        TIFFClose(tif);
        return 1;
    }

    for (i = 0; i < image->comps[0].h; ++i) {
        cvtPxToCx(planes, buffer32s, (OPJ_SIZE_T)width, adjust);
        cvt32sToTif(buffer32s, (OPJ_BYTE *)buf, (OPJ_SIZE_T)width * numcomps);
        (void)TIFFWriteEncodedStrip(tif, i, (void*)buf, (tsize_t)strip_size);
        planes[0] += width;
        planes[1] += width;
        planes[2] += width;
        planes[3] += width;
    }
    _TIFFfree((void*)buf);
    TIFFClose(tif);
    free(buffer32s);

    return 0;
}